

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O3

Pair * ZXing::OneD::ReadPair(Pair *__return_storage_ptr__,PatternView *view,Direction dir)

{
  Iterator puVar1;
  int iVar2;
  int iVar3;
  Character CVar4;
  Character CVar5;
  int *piVar6;
  Iterator puVar7;
  byte bVar8;
  Iterator puVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  long lVar13;
  PatternView *pattern;
  int i;
  ulong uVar14;
  float fVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar16 [16];
  short sVar21;
  short sVar22;
  undefined1 auVar20 [16];
  float bestVariance;
  int finder;
  float local_c8;
  uint local_c4;
  Pair *local_c0;
  PatternView local_b8;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  PatternView local_78;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  puVar1 = view->_data;
  uStack_88 = 0x10002;
  uStack_84 = 0x2000200090001;
  uStack_98 = 0x3000200080001;
  uStack_90 = 0x10001;
  local_8c = 0x60005;
  local_b8._base = (Iterator)0x1000100030006;
  local_b8._end = (Iterator)0x1000300040006;
  local_b8._data = (Iterator)0x8000400010001;
  local_b8._8_8_ = 0x4000100010001;
  local_78._data = (Iterator)0x1000400080001;
  local_78._8_8_ = 0x4000600030001;
  local_78._base = (Iterator)0x4000300010001;
  local_78._end = (Iterator)0x3000100010006;
  local_58 = 0x1000100080002;
  uStack_50 = 0x60002;
  uStack_4c = 0x10005;
  uStack_48 = 0x20001;
  uStack_44 = 0x1000100090002;
  pattern = &local_78;
  if (dir == Left) {
    pattern = &local_b8;
  }
  uVar10 = 0xffffffff;
  local_c8 = 0.2;
  uVar14 = 0;
  local_c0 = __return_storage_ptr__;
  do {
    fVar15 = RowReader::PatternMatchVariance<unsigned_short,unsigned_short>
                       (puVar1 + 8,(unsigned_short *)pattern,5,0.45);
    if (fVar15 < local_c8) {
      uVar10 = uVar14 & 0xffffffff;
      local_c8 = fVar15;
    }
    else if ((fVar15 == local_c8) && (!NAN(fVar15) && !NAN(local_c8))) {
      uVar10 = 0xffffffff;
    }
    uVar14 = uVar14 + 1;
    pattern = (PatternView *)((long)&pattern->_size + 2);
  } while (uVar14 != 6);
  uVar12 = ~(uint)uVar10;
  if (dir != Left) {
    uVar12 = (uint)uVar10 + 1;
  }
  if (uVar12 == 0) goto LAB_00161925;
  local_b8._data = view->_data;
  local_b8._size = 8;
  local_b8._base = view->_base;
  local_b8._end = view->_end;
  local_c4 = uVar12;
  CVar4 = ReadDataCharacter(&local_b8,uVar12,false);
  iVar3 = CVar4.value;
  if ((iVar3 == -1) ||
     ((uVar12 == 1 &&
      ((iVar3 < -0x1a5 ||
       (iVar2 = iVar3 >> 0x1f, iVar3 = iVar3 / 0xd3 + iVar2,
       9 < (((iVar3 - iVar2) - ((iVar3 - iVar2) + 5 >> 0x1f)) + 5 >> 1) - 2U))))))
  goto LAB_00161925;
  puVar1 = view->_data;
  if ((puVar1 + 0xd < view->_base) || (view->_end < puVar1 + 0x15)) {
LAB_00161883:
    uVar10 = 0;
  }
  else {
    lVar13 = -10;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *(short *)((long)puVar1 + lVar13 + 0x1a);
      lVar13 = lVar13 + 2;
    } while (lVar13 != 0);
    sVar21 = puVar1[0x13] + puVar1[0xf];
    sVar22 = puVar1[0x14] + puVar1[0x10];
    sVar17 = sVar22 + puVar1[0x12] + puVar1[0xe];
    sVar18 = sVar22 + puVar1[0x12] * 2;
    sVar19 = sVar22 + puVar1[0x14] * 2;
    auVar20._0_2_ = sVar17 + sVar21 + puVar1[0x11] + puVar1[0xd];
    auVar20._2_2_ = sVar17;
    auVar20._4_2_ = 0;
    auVar20._6_2_ = sVar22 * 2;
    auVar20._8_2_ = sVar18 + sVar21 + puVar1[0x11] * 2;
    auVar20._10_2_ = sVar18;
    auVar20._12_2_ = sVar19 + sVar21 + puVar1[0x13] * 2;
    auVar20._14_2_ = sVar19;
    auVar20 = auVar20 & _DAT_00196990;
    uVar10 = auVar20._0_8_ & 0xffff0000ffffffff;
    auVar16._0_4_ = (float)(int)uVar10;
    auVar16._4_4_ = (float)(int)((uint)(uVar10 >> 0x20) | (uint)uVar11);
    auVar16._8_4_ = (float)auVar20._8_4_;
    auVar16._12_4_ = (float)auVar20._12_4_;
    auVar16 = divps(auVar16,_DAT_00196c20);
    if (0.1 <= ABS(auVar16._0_4_ / auVar16._4_4_ + -1.0)) goto LAB_00161883;
    local_b8._size = 8;
    local_b8._data = puVar1 + 0xd;
    local_b8._base = view->_base;
    local_b8._end = view->_end;
    CVar5 = ReadDataCharacter(&local_b8,uVar12,true);
    uVar10 = (ulong)CVar5 >> 0x20;
    if (CVar5.value != -1) {
      bVar8 = 1;
      local_c4 = uVar12;
      goto LAB_001618b1;
    }
  }
  piVar6 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (VALID_HALF_PAIRS,
                      ParseFinderPattern(ZXing::PatternView_const&,ZXing::OneD::Direction)::
                      FINDER_PATTERNS,&local_c4);
  if (piVar6 != (int *)ParseFinderPattern(ZXing::PatternView_const&,ZXing::OneD::Direction)::
                       FINDER_PATTERNS) {
    CVar5.value = -1;
    CVar5.checksum = 0;
    bVar8 = 0;
LAB_001618b1:
    local_c0->left = CVar4;
    local_c0->right = (Character)((ulong)CVar5 & 0xffffffff | uVar10 << 0x20);
    local_c0->finder = local_c4;
    puVar1 = view->_data;
    puVar7 = view->_base;
    uVar11 = 0;
    uVar12 = 0;
    puVar9 = puVar7;
    if (puVar7 != puVar1) {
      do {
        uVar11 = uVar11 + *puVar9;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar1);
      uVar12 = (uint)uVar11;
    }
    local_c0->xStart = uVar12;
    puVar9 = puVar1 + 0xd;
    if (bVar8 == 0) {
      puVar9 = puVar1 + 8;
    }
    puVar9 = (Iterator)((long)puVar9 + (ulong)((uint)bVar8 * 6) + 10);
    if (puVar7 == puVar9) {
      iVar3 = -1;
    }
    else {
      uVar11 = 0;
      do {
        uVar11 = uVar11 + *puVar7;
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar9);
      iVar3 = uVar11 - 1;
    }
    local_c0->xStop = iVar3;
    local_c0->y = -1;
    local_c0->count = 1;
    return (Pair *)0x1ffffffff;
  }
LAB_00161925:
  (local_c0->left).value = -1;
  (local_c0->left).checksum = 0;
  (local_c0->right).value = -1;
  (local_c0->right).checksum = 0;
  local_c0->finder = 0;
  local_c0->xStart = -1;
  local_c0->xStop = 1;
  local_c0->y = -1;
  local_c0->count = 1;
  return local_c0;
}

Assistant:

static Pair ReadPair(const PatternView& view, Direction dir)
{
	if (int finder = ParseFinderPattern(Finder(view), dir))
		if (auto charL = ReadDataCharacter(LeftChar(view), finder, false))
			if (finder != FINDER_A || ChecksumIsValid(charL)) {
				auto charR = RightChar(view).isValid() && IsCharacter(RightChar(view), 17, ModSizeFinder(view))
								 ? ReadDataCharacter(RightChar(view), finder, true)
								 : Character();
				if (charR || Contains(VALID_HALF_PAIRS, finder))
					return {charL, charR, finder, view.pixelsInFront(),
							(charR ? RightChar(view) : Finder(view)).pixelsTillEnd()};
			}

	return {};
}